

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O3

void ShiftBytes(VP8LBitReader *br)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  bVar2 = true;
  if (7 < br->bit_pos_) {
    uVar4 = br->pos_;
    iVar3 = br->bit_pos_;
    do {
      iVar5 = iVar3;
      if (br->len_ <= uVar4) break;
      uVar1 = br->val_;
      br->val_ = uVar1 >> 8;
      br->val_ = (ulong)br->buf_[uVar4] << 0x38 | uVar1 >> 8;
      uVar4 = uVar4 + 1;
      br->pos_ = uVar4;
      iVar5 = iVar3 + -8;
      br->bit_pos_ = iVar5;
      bVar2 = 0xf < iVar3;
      iVar3 = iVar5;
    } while (bVar2);
    bVar2 = iVar5 < 0x41;
  }
  if ((br->eos_ != 0) || (!(bool)(bVar2 | br->pos_ != br->len_))) {
    br->bit_pos_ = 0;
    br->eos_ = 1;
  }
  return;
}

Assistant:

static void ShiftBytes(VP8LBitReader* const br) {
  while (br->bit_pos_ >= 8 && br->pos_ < br->len_) {
    br->val_ >>= 8;
    br->val_ |= ((vp8l_val_t)br->buf_[br->pos_]) << (VP8L_LBITS - 8);
    ++br->pos_;
    br->bit_pos_ -= 8;
  }
  if (VP8LIsEndOfStream(br)) {
    VP8LSetEndOfStream(br);
  }
}